

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.h
# Opt level: O1

SQObjectPtr * __thiscall SQObjectPtr::operator=(SQObjectPtr *this,SQObject *obj)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  
  SVar2 = (this->super_SQObject)._type;
  pSVar4 = (this->super_SQObject)._unVal.pTable;
  (this->super_SQObject)._unVal = obj->_unVal;
  SVar3 = obj->_type;
  (this->super_SQObject)._type = SVar3;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(((this->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  return this;
}

Assistant:

inline SQObjectPtr& operator=(const SQObject& obj)
    {
        SQObjectType tOldType;
        SQObjectValue unOldVal;
        tOldType=_type;
        unOldVal=_unVal;
        _unVal = obj._unVal;
        _type = obj._type;
        __AddRef(_type,_unVal);
        __Release(tOldType,unOldVal);
        return *this;
    }